

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-kv-cache.cpp
# Opt level: O2

void llama_kv_cache_view_free(llama_kv_cache_view *view)

{
  if (view->cells != (llama_kv_cache_view_cell *)0x0) {
    free(view->cells);
    view->cells = (llama_kv_cache_view_cell *)0x0;
  }
  if (view->cells_sequences != (llama_seq_id *)0x0) {
    free(view->cells_sequences);
    view->cells_sequences = (llama_seq_id *)0x0;
  }
  return;
}

Assistant:

void llama_kv_cache_view_free(llama_kv_cache_view * view) {
    if (view->cells != nullptr) {
        free(view->cells);
        view->cells = nullptr;
    }
    if (view->cells_sequences != nullptr) {
        free(view->cells_sequences);
        view->cells_sequences = nullptr;
    }
}